

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeDirs,cmGeneratorTarget *target,string *lang,string *config,bool forResponseFile)

{
  cmMakefile *pcVar1;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmLocalGenerator_cxx:262:5)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmLocalGenerator_cxx:262:5)>
  __comp_00;
  cmGeneratorTarget *this_00;
  pointer __last;
  bool bVar2;
  long lVar3;
  cmValue cVar4;
  ostream *poVar5;
  string *psVar6;
  undefined8 uVar7;
  pointer pbVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  string_view source;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  string_view str;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar13;
  string flags;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string sep;
  string frameworkDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  ostringstream includeFlags;
  undefined1 local_318 [24];
  char *local_300;
  cmLocalGenerator *local_2f8;
  undefined4 local_2f0;
  OutputFormat local_2ec;
  string *local_2e8;
  string *local_2e0;
  string *local_2d8;
  cmGeneratorTarget *local_2d0;
  undefined1 local_2c8 [8];
  undefined1 auStack_2c0 [24];
  _Base_ptr local_2a8;
  char *local_2a0;
  string *local_298;
  undefined8 local_290;
  string *local_288;
  string *local_280;
  string *local_278;
  string *local_270;
  _Base_ptr *local_268;
  long local_260;
  _Base_ptr local_258 [2];
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string local_210;
  string *local_1f0;
  string *local_1e8;
  cmOutputConverter *local_1e0;
  string *local_1d8;
  string *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_2f8 = this;
  local_2e0 = config;
  if (lang->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_228,includeDirs);
    __last = local_228.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar8 = local_228.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_318._0_8_ = target;
    if (target != (cmGeneratorTarget *)0x0) {
      local_2c8 = (undefined1  [8])local_318;
      auStack_2c0._0_8_ = local_2e0;
      auStack_2c0._8_8_ = lang;
      if (local_228.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_228.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar3 = (long)local_228.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_228.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1a8,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )local_228.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                            (lVar3 - (lVar3 + 1 >> 0x3f)) + 1 >> 1);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._16_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          __comp_00._M_comp.config = (string *)auStack_2c0._0_8_;
          __comp_00._M_comp.target = (cmGeneratorTarget **)local_2c8;
          __comp_00._M_comp.lang = (string *)auStack_2c0._8_8_;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar8,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )__last,__comp_00);
        }
        else {
          __comp._M_comp.config = (string *)auStack_2c0._0_8_;
          __comp._M_comp.target = (cmGeneratorTarget **)local_2c8;
          __comp._M_comp.lang = (string *)auStack_2c0._8_8_;
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar8,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )__last,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8._16_8_,local_1a8._8_8_,__comp);
        }
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Temporary_buffer
                  ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1a8);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar1 = local_2f8->Makefile;
    auStack_2c0._16_8_ = (lang->_M_dataplus)._M_p;
    auStack_2c0._8_8_ = lang->_M_string_length;
    local_2c8 = (undefined1  [8])0x13;
    auStack_2c0._0_8_ = "CMAKE_INCLUDE_FLAG_";
    views._M_len = 2;
    views._M_array = (iterator)local_2c8;
    cmCatViews_abi_cxx11_((string *)local_318,views);
    local_1e8 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_318);
    if ((cmGeneratorTarget *)local_318._0_8_ != (cmGeneratorTarget *)(local_318 + 0x10)) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    pcVar1 = local_2f8->Makefile;
    local_2c8 = (undefined1  [8])(auStack_2c0 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c8,"CMAKE_QUOTE_INCLUDE_PATHS","");
    local_270 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_2c8);
    local_2d0 = target;
    if (local_2c8 != (undefined1  [8])(auStack_2c0 + 8)) {
      operator_delete((void *)local_2c8,auStack_2c0._8_8_ + 1);
    }
    local_268 = local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268," ","");
    pcVar1 = local_2f8->Makefile;
    auStack_2c0._16_8_ = (lang->_M_dataplus)._M_p;
    auStack_2c0._8_8_ = lang->_M_string_length;
    local_2c8 = (undefined1  [8])0x17;
    auStack_2c0._0_8_ = "CMAKE_INCLUDE_FLAG_SEP_";
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_2c8;
    cmCatViews_abi_cxx11_((string *)local_318,views_00);
    local_1d8 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_318);
    if ((cmGeneratorTarget *)local_318._0_8_ != (cmGeneratorTarget *)(local_318 + 0x10)) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    if (local_1d8 == (string *)0x0) {
      pcVar1 = local_2f8->Makefile;
      auStack_2c0._16_8_ = (lang->_M_dataplus)._M_p;
      auStack_2c0._8_8_ = lang->_M_string_length;
      local_2c8 = (undefined1  [8])0x1a;
      auStack_2c0._0_8_ = "CMAKE_INCLUDE_SYSTEM_FLAG_";
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_2c8;
      cmCatViews_abi_cxx11_((string *)local_318,views_01);
      local_2e8 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_318);
      if ((cmGeneratorTarget *)local_318._0_8_ != (cmGeneratorTarget *)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
      }
      pcVar1 = local_2f8->Makefile;
      auStack_2c0._16_8_ = (lang->_M_dataplus)._M_p;
      auStack_2c0._8_8_ = lang->_M_string_length;
      local_2c8 = (undefined1  [8])0x1b;
      auStack_2c0._0_8_ = "_CMAKE_INCLUDE_SYSTEM_FLAG_";
      local_2a8 = (_Base_ptr)0x8;
      local_2a0 = "_WARNING";
      views_02._M_len = 3;
      views_02._M_array = (iterator)local_2c8;
      cmCatViews_abi_cxx11_((string *)local_318,views_02);
      local_298 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_318);
      if ((cmGeneratorTarget *)local_318._0_8_ != (cmGeneratorTarget *)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_268);
      local_298 = (string *)0x0;
      local_2e8 = (string *)0x0;
    }
    pcVar1 = local_2f8->Makefile;
    auStack_2c0._16_8_ = (lang->_M_dataplus)._M_p;
    auStack_2c0._8_8_ = lang->_M_string_length;
    local_2c8 = (undefined1  [8])0x6;
    auStack_2c0._0_8_ = "CMAKE_";
    local_2a8 = (_Base_ptr)0x16;
    local_2a0 = "_FRAMEWORK_SEARCH_FLAG";
    views_03._M_len = 3;
    views_03._M_array = (iterator)local_2c8;
    cmCatViews_abi_cxx11_((string *)local_318,views_03);
    cVar4 = cmMakefile::GetDefinition(pcVar1,(string *)local_318);
    if ((cmGeneratorTarget *)local_318._0_8_ != (cmGeneratorTarget *)(local_318 + 0x10)) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    pcVar1 = local_2f8->Makefile;
    auStack_2c0._16_8_ = (lang->_M_dataplus)._M_p;
    auStack_2c0._8_8_ = lang->_M_string_length;
    local_2c8 = (undefined1  [8])0x6;
    auStack_2c0._0_8_ = "CMAKE_";
    local_2a8 = (_Base_ptr)0x1d;
    local_2a0 = "_SYSTEM_FRAMEWORK_SEARCH_FLAG";
    views_04._M_len = 3;
    views_04._M_array = (iterator)local_2c8;
    cmCatViews_abi_cxx11_((string *)local_318,views_04);
    local_288 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_318);
    local_278 = lang;
    if ((cmGeneratorTarget *)local_318._0_8_ != (cmGeneratorTarget *)(local_318 + 0x10)) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    auStack_2c0._16_8_ = auStack_2c0;
    auStack_2c0._0_8_ = auStack_2c0._0_8_ & 0xffffffff00000000;
    auStack_2c0._8_8_ = 0;
    local_2a0 = (char *)0x0;
    local_1d0 = local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    uVar7 = 0;
    local_2a8 = (_Base_ptr)auStack_2c0._16_8_;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar9 = local_2e8 == (string *)0x0;
      bVar10 = local_2d0 == (cmGeneratorTarget *)0x0;
      bVar11 = local_288 == (string *)0x0;
      local_280 = cVar4.Value;
      if (cVar4.Value == (string *)0x0) {
        local_280 = &cmValue::Empty_abi_cxx11_;
      }
      local_2ec = (uint)forResponseFile + (uint)forResponseFile * 2;
      local_1e0 = &local_2f8->super_cmOutputConverter;
      local_2f0 = 0;
      local_290 = 0;
      pbVar8 = local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2d8 = cVar4.Value;
      local_1f0 = __return_storage_ptr__;
      do {
        if (cVar4.Value == (string *)0x0) {
          bVar12 = false;
        }
        else {
          bVar12 = (cVar4.Value)->_M_string_length != 0;
        }
        if (bVar12) {
          pcVar1 = local_2f8->Makefile;
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"APPLE","");
          bVar2 = cmMakefile::IsOn(pcVar1,&local_210);
          if (!bVar2) goto LAB_0027e7ef;
          bVar2 = cmSystemTools::IsPathToFramework(pbVar8);
        }
        else {
LAB_0027e7ef:
          bVar2 = false;
        }
        if ((bVar12) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2)) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        cVar4.Value = local_2d8;
        if (bVar2 == false) {
          if (((byte)local_2f0 & local_1d8 != (string *)0x0) == 0) {
            if ((bVar9 || bVar10) ||
               (bVar12 = cmGeneratorTarget::IsSystemIncludeDirectory
                                   (local_2d0,pbVar8,local_2e0,local_278), !bVar12)) {
              local_2f0 = (undefined4)CONCAT71((int7)((ulong)local_1e8 >> 8),1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_1e8->_M_dataplus)._M_p,
                         local_1e8->_M_string_length);
            }
            else {
              local_290 = CONCAT71((int7)((ulong)local_2e8 >> 8),1);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(local_2e8->_M_dataplus)._M_p,
                                  local_2e8->_M_string_length);
              local_2f0 = (undefined4)CONCAT71((int7)((ulong)poVar5 >> 8),1);
            }
          }
          (*local_2f8->_vptr_cmLocalGenerator[0x11])(local_318,local_2f8,pbVar8,(ulong)local_2ec);
          if (((local_270 != (string *)0x0) && ((pointer)local_318._8_8_ != (pointer)0x0)) &&
             (*(char *)local_318._0_8_ != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_318._0_8_,local_318._8_8_);
          if (((local_270 != (string *)0x0) && ((pointer)local_318._8_8_ != (pointer)0x0)) &&
             (*(char *)local_318._0_8_ != '\"')) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_268,local_260);
          if ((cmGeneratorTarget *)local_318._0_8_ != (cmGeneratorTarget *)(local_318 + 0x10)) {
            operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
          }
        }
        else {
          local_318._8_8_ = (pbVar8->_M_dataplus)._M_p;
          local_318._0_8_ = pbVar8->_M_string_length;
          local_318._16_8_ = 4;
          local_300 = "/../";
          views_05._M_len = 2;
          views_05._M_array = (iterator)local_318;
          cmCatViews_abi_cxx11_(&local_1c8,views_05);
          this_00 = local_2d0;
          cmsys::SystemTools::CollapseFullPath(&local_248,&local_1c8);
          cVar4.Value = local_2d8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          pVar13 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)local_2c8,&local_248);
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if ((bVar11 || bVar10) ||
               (bVar12 = cmGeneratorTarget::IsSystemIncludeDirectory
                                   (this_00,pbVar8,local_2e0,local_278), psVar6 = local_288, !bVar12
               )) {
              psVar6 = local_280;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
            source._M_str = local_248._M_dataplus._M_p;
            source._M_len = local_248._M_string_length;
            cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                      ((string *)local_318,local_1e0,source,local_2ec);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_318._0_8_,local_318._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            if ((cmGeneratorTarget *)local_318._0_8_ != (cmGeneratorTarget *)(local_318 + 0x10)) {
              operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
        }
        pbVar8 = pbVar8 + 1;
        uVar7 = local_290;
        __return_storage_ptr__ = local_1f0;
      } while (pbVar8 != local_1d0);
    }
    if (((byte)uVar7 & local_298 != (string *)0x0) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(local_298->_M_dataplus)._M_p,local_298->_M_string_length);
    }
    std::__cxx11::stringbuf::str();
    if (((*(char *)local_268 != ' ') && ((pointer)local_318._8_8_ != (pointer)0x0)) &&
       (((char *)(local_318._0_8_ + -1))[local_318._8_8_] == *(char *)local_268)) {
      ((char *)(local_318._0_8_ + -1))[local_318._8_8_] = ' ';
    }
    str._M_str = (char *)local_318._0_8_;
    str._M_len = local_318._8_8_;
    cmTrimWhitespace_abi_cxx11_(__return_storage_ptr__,str);
    if ((cmGeneratorTarget *)local_318._0_8_ != (cmGeneratorTarget *)(local_318 + 0x10)) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2c8);
    if (local_268 != local_258) {
      operator_delete(local_268,(ulong)((long)&local_258[0]->_M_color + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_228);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  std::vector<std::string> const& includeDirs, cmGeneratorTarget* target,
  std::string const& lang, std::string const& config, bool forResponseFile)
{
  if (lang.empty()) {
    return "";
  }

  std::vector<std::string> includes = includeDirs;
  MoveSystemIncludesToEnd(includes, config, lang, target);

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string const& includeFlag =
    this->Makefile->GetSafeDefinition(cmStrCat("CMAKE_INCLUDE_FLAG_", lang));
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  std::string sep = " ";
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (cmValue incSep = this->Makefile->GetDefinition(
        cmStrCat("CMAKE_INCLUDE_FLAG_SEP_", lang))) {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    sep = incSep;
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  cmValue sysIncludeFlag = nullptr;
  cmValue sysIncludeFlagWarning = nullptr;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(
      cmStrCat("CMAKE_INCLUDE_SYSTEM_FLAG_", lang));
    sysIncludeFlagWarning = this->Makefile->GetDefinition(
      cmStrCat("_CMAKE_INCLUDE_SYSTEM_FLAG_", lang, "_WARNING"));
  }

  cmValue fwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_FRAMEWORK_SEARCH_FLAG"));
  cmValue sysFwSearchFlag = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_SYSTEM_FRAMEWORK_SEARCH_FLAG"));

  bool flagUsed = false;
  bool sysIncludeFlagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  for (std::string const& i : includes) {
    if (cmNonempty(fwSearchFlag) && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i)) {
      std::string const frameworkDir =
        cmSystemTools::CollapseFullPath(cmStrCat(i, "/../"));
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(i, config, lang)) {
          includeFlags << *sysFwSearchFlag;
        } else {
          includeFlags << *fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(i, config, lang)) {
        includeFlags << *sysIncludeFlag;
        sysIncludeFlagUsed = true;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath = this->ConvertToIncludeReference(i, shellFormat);
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  if (sysIncludeFlagUsed && sysIncludeFlagWarning) {
    includeFlags << *sysIncludeFlagWarning;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags.back() == sep[0]) {
    flags.back() = ' ';
  }
  return cmTrimWhitespace(flags);
}